

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O1

void __thiscall PrintAST::visit(PrintAST *this,BooleanOPNode *node)

{
  ExpNode *pEVar1;
  char *node_name;
  
  node_name = token_id_to_name(node->op->token);
  printAST(this,node_name);
  this->level = this->level + 1;
  pEVar1 = node->exp1;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
  }
  pEVar1 = node->exp2;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(BooleanOPNode *node) {
    this->printAST(token_id_to_name(node->getOp()->getToken()));
    up_level();
    if (node->getExp1() != nullptr) {
        node->getExp1()->accept(this);
    }
    if (node->getExp2() != nullptr) {
        node->getExp2()->accept(this);
    }
    down_level();
}